

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void __thiscall LogMessage::Flush(LogMessage *this)

{
  string s;
  
  std::operator<<((ostream *)&this->str_,"\n");
  if (re2::FLAGS_minloglevel <= this->severity_) {
    std::__cxx11::stringbuf::str();
    fwrite(s._M_dataplus._M_p,1,s._M_string_length,_stderr);
    std::__cxx11::string::~string((string *)&s);
  }
  this->flushed_ = true;
  return;
}

Assistant:

void Flush() {
    stream() << "\n";
    if (severity_ >= re2::FLAGS_minloglevel) {
      string s = str_.str();
      size_t n = s.size();
      if (fwrite(s.data(), 1, n, stderr) < n) {}  // shut up gcc
    }
    flushed_ = true;
  }